

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

void halfsiphash_test(void *input,int len,uint32_t seed,void *out)

{
  uint32_t uVar1;
  uint32_t *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  uchar *in_RDI;
  uchar key [16];
  undefined4 local_28 [4];
  uint32_t *local_18;
  undefined4 local_10;
  int local_c;
  uchar *local_8;
  
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_28,0,0x10);
  if (local_c == 0) {
    *local_18 = 0;
  }
  else {
    local_28[0] = local_10;
    uVar1 = halfsiphash((uchar *)local_28,local_8,(long)local_c);
    *local_18 = uVar1;
  }
  return;
}

Assistant:

void
halfsiphash_test(const void *input, int len, uint32_t seed, void *out)
{
  unsigned char	key[16] = {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0};
  if (!len) {
    *(uint32_t *) out = 0;
    return;
  }
  memcpy(key, &seed, sizeof(seed));
  // objsize: 0x780-0xa3c: 700
  *(uint32_t *) out = halfsiphash(key, (const unsigned char *)input, (size_t) len);
}